

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::element_at(RepeatedPtrFieldBase *this,int index)

{
  Nullable<const_char_*> failure_msg;
  Rep *pRVar1;
  LogMessageFatal local_20;
  
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl(index,0,"index == 0");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x29c,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
    }
  }
  else {
    pRVar1 = rep(this);
    this = (RepeatedPtrFieldBase *)(pRVar1->elements + index);
  }
  return &this->tagged_rep_or_elem_;
}

Assistant:

void*& element_at(int index) {
    if (using_sso()) {
      ABSL_DCHECK_EQ(index, 0);
      return tagged_rep_or_elem_;
    }
    return rep()->elements[index];
  }